

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::
ParseUndisambiguatedIdentifier(RustSymbolParser *this,char uppercase_namespace,int disambiguator)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  Nullable<char_*> pcVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  int iVar14;
  undefined1 in_stack_00000040 [32];
  undefined4 local_30;
  
  pcVar12 = this->encoding_;
  uVar10 = (ulong)(uint)this->pos_;
  uVar11 = (ulong)this->pos_;
  cVar1 = pcVar12[uVar11];
  cVar13 = cVar1;
  if (cVar1 == 'u') {
    uVar10 = uVar11 + 1;
    this->pos_ = (int)uVar10;
    lVar4 = uVar11 + 1;
    uVar11 = uVar10;
    cVar13 = pcVar12[lVar4];
  }
  if (9 < (byte)(cVar13 - 0x30U)) {
    return false;
  }
  iVar9 = (int)uVar10 + 1;
  this->pos_ = iVar9;
  iVar14 = pcVar12[uVar11] + -0x30;
  if (iVar14 == 0) {
    iVar14 = 0;
  }
  else if ((byte)(pcVar12[iVar9] - 0x30U) < 10) {
    pcVar7 = pcVar12 + iVar9;
    do {
      pcVar6 = pcVar7 + 1;
      if (0xccccccb < iVar14) {
        return false;
      }
      iVar9 = iVar9 + 1;
      this->pos_ = iVar9;
      iVar14 = (int)*pcVar7 + iVar14 * 10 + -0x30;
      pcVar7 = pcVar6;
    } while ((byte)(*pcVar6 - 0x30U) < 10);
  }
  if (pcVar12[iVar9] == '_') {
    this->pos_ = iVar9 + 1;
  }
  if (cVar1 == 'u') {
    pcVar8 = DecodeRustPunycode((DecodeRustPunycodeOptions)in_stack_00000040);
    this->out_ = pcVar8;
    if (pcVar8 == (Nullable<char_*>)0x0) {
      return false;
    }
    this->pos_ = this->pos_ + iVar14;
  }
  if (uppercase_namespace == '\0') {
LAB_002611ec:
    if ((cVar1 != 'u') && (0 < iVar14)) {
      do {
        iVar9 = this->pos_;
        this->pos_ = iVar9 + 1;
        bVar2 = this->encoding_[iVar9];
        if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) &&
           (((-1 < (char)bVar2 && (bVar2 != 0x5f)) && ((byte)(bVar2 - 0x3a) < 0xf6)))) {
          return false;
        }
        if (this->silence_depth_ < 1) {
          pbVar3 = (byte *)this->out_;
          if ((long)this->out_end_ - (long)pbVar3 < 2) {
            return false;
          }
          this->out_ = (char *)(pbVar3 + 1);
          *pbVar3 = bVar2;
          *this->out_ = '\0';
        }
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    if (uppercase_namespace == '\0') {
      return true;
    }
  }
  else {
    if (uppercase_namespace == 'S') {
      pcVar12 = "{shim";
LAB_002611ae:
      bVar5 = Emit(this,pcVar12);
      if (!bVar5) {
        return false;
      }
    }
    else {
      if (uppercase_namespace == 'C') {
        pcVar12 = "{closure";
        goto LAB_002611ae;
      }
      if (this->silence_depth_ < 1) {
        pcVar12 = this->out_;
        if ((long)this->out_end_ - (long)pcVar12 < 2) {
          return false;
        }
        this->out_ = pcVar12 + 1;
        *pcVar12 = '{';
        *this->out_ = '\0';
        if (this->silence_depth_ < 1) {
          pcVar12 = this->out_;
          if ((long)this->out_end_ - (long)pcVar12 < 2) {
            return false;
          }
          this->out_ = pcVar12 + 1;
          *pcVar12 = uppercase_namespace;
          *this->out_ = '\0';
        }
      }
    }
    if (0 < iVar14) {
      bVar5 = Emit(this,":");
      if (!bVar5) {
        return false;
      }
      goto LAB_002611ec;
    }
  }
  if (this->silence_depth_ < 1) {
    pcVar12 = this->out_;
    if ((long)this->out_end_ - (long)pcVar12 < 2) {
      return false;
    }
    this->out_ = pcVar12 + 1;
    *pcVar12 = '#';
    *this->out_ = '\0';
  }
  if (disambiguator < 0) {
    if (0 < this->silence_depth_) {
      return true;
    }
    pcVar12 = this->out_;
    if ((long)this->out_end_ - (long)pcVar12 < 2) {
      return false;
    }
    this->out_ = pcVar12 + 1;
    *pcVar12 = '?';
  }
  else {
    if (disambiguator != 0) {
      pcVar12 = (char *)((long)&local_30 + 3);
      local_30 = 0;
      do {
        pcVar12[-1] = (char)disambiguator + (char)((uint)disambiguator / 10) * -10 | 0x30;
        pcVar12 = pcVar12 + -1;
        bVar5 = 9 < (uint)disambiguator;
        disambiguator = (uint)disambiguator / 10;
      } while (bVar5);
      bVar5 = Emit(this,pcVar12);
      if (!bVar5) {
        return false;
      }
      goto LAB_0026140d;
    }
    if (0 < this->silence_depth_) {
      return true;
    }
    pcVar12 = this->out_;
    if ((long)this->out_end_ - (long)pcVar12 < 2) {
      return false;
    }
    this->out_ = pcVar12 + 1;
    *pcVar12 = '0';
  }
  *this->out_ = '\0';
LAB_0026140d:
  if (0 < this->silence_depth_) {
    return true;
  }
  pcVar12 = this->out_;
  if ((long)this->out_end_ - (long)pcVar12 < 2) {
    return false;
  }
  this->out_ = pcVar12 + 1;
  *pcVar12 = '}';
  *this->out_ = '\0';
  return true;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseUndisambiguatedIdentifier(
      char uppercase_namespace = '\0', int disambiguator = 0) {
    // undisambiguated-identifier -> u? decimal-number _? bytes
    const bool is_punycoded = Eat('u');
    if (!IsDigit(Peek())) return false;
    int num_bytes = 0;
    if (!ParseDecimalNumber(num_bytes)) return false;
    (void)Eat('_');  // optional separator, needed if a digit follows
    if (is_punycoded) {
      DecodeRustPunycodeOptions options;
      options.punycode_begin = &encoding_[pos_];
      options.punycode_end = &encoding_[pos_] + num_bytes;
      options.out_begin = out_;
      options.out_end = out_end_;
      out_ = DecodeRustPunycode(options);
      if (out_ == nullptr) return false;
      pos_ += static_cast<size_t>(num_bytes);
    }

    // Emit the beginnings of braced forms like {shim:vtable#0}.
    if (uppercase_namespace != '\0') {
      switch (uppercase_namespace) {
        case 'C':
          if (!Emit("{closure")) return false;
          break;
        case 'S':
          if (!Emit("{shim")) return false;
          break;
        default:
          if (!EmitChar('{') || !EmitChar(uppercase_namespace)) return false;
          break;
      }
      if (num_bytes > 0 && !Emit(":")) return false;
    }

    // Emit the name itself.
    if (!is_punycoded) {
      for (int i = 0; i < num_bytes; ++i) {
        const char c = Take();
        if (!IsIdentifierChar(c) &&
            // The spec gives toolchains the choice of Punycode or raw UTF-8 for
            // identifiers containing code points above 0x7f, so accept bytes
            // with the high bit set.
            (c & 0x80) == 0) {
          return false;
        }
        if (!EmitChar(c)) return false;
      }
    }

    // Emit the endings of braced forms, e.g., "#42}".
    if (uppercase_namespace != '\0') {
      if (!EmitChar('#')) return false;
      if (!EmitDisambiguator(disambiguator)) return false;
      if (!EmitChar('}')) return false;
    }

    return true;
  }